

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O3

void __thiscall Population::add_creature(Population *this,Creature *crt)

{
  iterator __position;
  double dVar1;
  double dVar2;
  double dVar3;
  Population *pPVar4;
  uint64_t uVar5;
  bool bVar6;
  undefined6 uVar7;
  Creature *p;
  undefined1 local_38 [8];
  shared_ptr<Creature> nc;
  
  p = (Creature *)operator_new(0x50);
  p->_vptr_Creature = (_func_int **)&PTR__Creature_0011d700;
  std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>::
  vector(&p->chroms,&crt->chroms);
  dVar1 = (crt->domain).first;
  dVar2 = (crt->domain).second;
  dVar3 = crt->fitness;
  pPVar4 = crt->pntpop;
  bVar6 = crt->elite;
  uVar7 = *(undefined6 *)&crt->field_0x42;
  uVar5 = crt->SERIALNO;
  p->dead = crt->dead;
  p->elite = bVar6;
  *(undefined6 *)&p->field_0x42 = uVar7;
  p->SERIALNO = uVar5;
  p->fitness = dVar3;
  p->pntpop = pPVar4;
  (p->domain).first = dVar1;
  (p->domain).second = dVar2;
  boost::shared_ptr<Creature>::shared_ptr<Creature>((shared_ptr<Creature> *)local_38,p);
  std::vector<boost::shared_ptr<Creature>,_std::allocator<boost::shared_ptr<Creature>_>_>::push_back
            (&this->creats,(shared_ptr<Creature> *)local_38);
  if (local_38 != (undefined1  [8])0x0) {
    nc.pn.pi_ = *(sp_counted_base **)((long)local_38 + 0x30);
    __position._M_current =
         (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->fitdict,__position,(double *)&nc.pn);
    }
    else {
      *__position._M_current = (double)nc.pn.pi_;
      (this->fitdict).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    boost::detail::shared_count::~shared_count((shared_count *)&nc);
    return;
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Creature>::operator->() const [T = Creature]"
               );
}

Assistant:

void Population::add_creature( const Creature& crt )
{
	boost::shared_ptr<Creature> nc(new Creature(crt));
	creats.push_back(nc);

	fitdict.push_back(nc->get_fitness());
}